

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall nonius::junit_reporter::do_benchmark_failure(junit_reporter *this,exception_ptr *e)

{
  void *pvVar1;
  void *pvVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  void *__tmp;
  long lVar5;
  rep *prVar6;
  estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *peVar7;
  byte bVar8;
  void *local_98;
  undefined8 uStack_90;
  long local_88;
  rep arStack_80 [12];
  void *local_20;
  
  bVar8 = 0;
  arStack_80[9] = 0.0;
  arStack_80[10] = 0.0;
  arStack_80[7] = 0.0;
  arStack_80[8] = 0.0;
  arStack_80[5] = 0.0;
  arStack_80[6] = 0.0;
  arStack_80[3] = 0.0;
  arStack_80[4] = 0.0;
  arStack_80[1] = 0.0;
  arStack_80[2] = 0.0;
  local_88 = 0;
  arStack_80[0] = 0.0;
  local_98 = (void *)0x0;
  uStack_90 = 0;
  arStack_80[0xb] = 0.0;
  local_20 = e->_M_exception_object;
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::junit_reporter::result>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->data,&this->current);
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
  ::_M_move_assign((vector<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                    *)pmVar3,&local_98);
  pvVar2 = local_20;
  prVar6 = arStack_80;
  peVar7 = &(pmVar3->analysis).mean;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    (peVar7->point).__r = *prVar6;
    prVar6 = prVar6 + (ulong)bVar8 * -2 + 1;
    peVar7 = (estimate<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)
             ((long)peVar7 + (ulong)bVar8 * -0x10 + 8);
  }
  local_20 = (void *)0x0;
  pvVar1 = (pmVar3->failure)._M_exception_object;
  (pmVar3->failure)._M_exception_object = pvVar2;
  if (pvVar1 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_98 != (void *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->current)._M_dataplus._M_p,
                      (this->current)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," failed to run successfully\n",0x1c);
  return;
}

Assistant:

void do_benchmark_failure(std::exception_ptr e) override {
            data[current] = { sample_analysis<fp_seconds>(), e };
            error_stream() << current << " failed to run successfully\n";
        }